

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O3

bool google::protobuf::util::ParseDelimitedFromCodedStream
               (MessageLite *message,CodedInputStream *input,bool *clean_eof)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  Limit limit;
  int64 iVar6;
  uint first_byte_or_zero;
  
  if (clean_eof != (bool *)0x0) {
    *clean_eof = false;
  }
  iVar1 = input->total_bytes_read_;
  pbVar3 = input->buffer_;
  pbVar4 = input->buffer_end_;
  iVar2 = input->buffer_size_after_limit_;
  if (pbVar3 < pbVar4) {
    first_byte_or_zero = (uint)*pbVar3;
    if (-1 < (char)*pbVar3) {
      input->buffer_ = pbVar3 + 1;
      goto LAB_002fd66f;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar6;
  if (iVar6 < 0) {
    if (clean_eof == (bool *)0x0) {
      return false;
    }
    *clean_eof = (input->total_bytes_read_ - input->buffer_size_after_limit_) +
                 (*(int *)&input->buffer_ - *(int *)&input->buffer_end_) ==
                 (iVar1 - iVar2) + ((int)pbVar3 - (int)pbVar4);
    return false;
  }
LAB_002fd66f:
  limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
  bVar5 = MessageLite::MergeFromCodedStream(message,input);
  if ((bVar5) && (input->legitimate_message_end_ == true)) {
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  return false;
}

Assistant:

bool ParseDelimitedFromCodedStream(MessageLite* message,
                                   io::CodedInputStream* input,
                                   bool* clean_eof) {
  if (clean_eof != NULL) *clean_eof = false;
  int start = input->CurrentPosition();

  // Read the size.
  uint32 size;
  if (!input->ReadVarint32(&size)) {
    if (clean_eof != NULL) *clean_eof = input->CurrentPosition() == start;
    return false;
  }

  // Tell the stream not to read beyond that size.
  io::CodedInputStream::Limit limit = input->PushLimit(size);

  // Parse the message.
  if (!message->MergeFromCodedStream(input)) return false;
  if (!input->ConsumedEntireMessage()) return false;

  // Release the limit.
  input->PopLimit(limit);

  return true;
}